

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStreamTest.hpp
# Opt level: O0

void Qentem::Test::TestStringStream1(QTest *test)

{
  bool bVar1;
  SizeT SVar2;
  SizeT SVar3;
  char *pcVar4;
  StringStream<char> *pSVar5;
  uint local_2e0;
  SizeT local_2dc;
  undefined1 local_2d8 [8];
  SimpleStream sis;
  String<char> n_str;
  StringStream<char> local_298;
  char *local_288;
  char *ss2_p;
  SizeT local_278;
  uint local_274;
  SizeT local_270;
  bool local_26a;
  bool local_269;
  uint local_268;
  SizeT local_264;
  char *local_260;
  char *ab2;
  uint local_250;
  SizeT local_24c;
  char *local_248;
  char *ab;
  char *buffer;
  SizeT local_230;
  uint local_22c;
  SizeT local_228;
  uint local_224;
  SizeT local_220;
  uint local_21c;
  SizeT local_218;
  uint local_214;
  SizeT local_210;
  uint local_20c;
  SizeT local_208;
  byte local_201;
  char *pcStack_200;
  bool is_equal;
  char *e_str;
  char local_1ed;
  uint local_1ec;
  SizeT local_1e8;
  char local_1e1;
  uint local_1e0;
  SizeT local_1dc;
  uint local_1d8;
  SizeT local_1d4;
  StringStream<char> local_1d0;
  uint local_1c0;
  SizeT local_1bc;
  uint local_1b8;
  SizeT local_1b4;
  StringStream<char> local_1b0;
  uint local_1a0;
  SizeT local_19c;
  uint local_198;
  SizeT local_194;
  uint local_190;
  SizeT local_18c;
  uint local_188;
  SizeT local_184;
  SizeT local_180;
  uint local_17c;
  SizeT local_178;
  SizeT local_174;
  SizeT local_170;
  SizeT lss;
  String<char> local_168;
  uint local_158;
  SizeT local_154;
  String<char> local_150;
  uint local_140;
  SizeT local_13c;
  String<char> local_138;
  undefined1 local_128 [8];
  String<char> sss;
  uint local_108;
  SizeT local_104;
  uint local_100;
  SizeT local_fc;
  String<char> local_f8;
  StringStream<char> local_e8;
  StringStream<char> local_d8;
  uint local_c8;
  SizeT local_c4;
  String<char> local_c0;
  uint local_b0;
  SizeT local_ac;
  uint local_a8;
  SizeT local_a4;
  StringStream<char> local_a0;
  char local_89;
  uint local_88;
  SizeT local_84;
  StringStream<char> local_80;
  uint local_70;
  SizeT local_6c;
  uint local_68;
  SizeT local_64;
  uint local_60;
  SizeT local_5c;
  uint local_58;
  SizeT local_54;
  uint local_50;
  SizeT local_4c;
  uint local_48;
  SizeT local_44;
  undefined1 local_40 [8];
  String<char> str;
  StringStream<char> ss2;
  StringStream<char> ss1;
  QTest *test_local;
  
  StringStream<char>::StringStream((StringStream<char> *)&ss2.length_);
  StringStream<char>::StringStream((StringStream<char> *)&str.length_,10);
  String<char>::String((String<char> *)local_40);
  local_44 = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  local_48 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_44,&local_48,0x25);
  local_4c = StringStream<char>::Capacity((StringStream<char> *)&ss2.length_);
  local_50 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_4c,&local_50,0x26);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&ss2.length_);
  QTest::IsNull(test,pcVar4,0x27);
  pcVar4 = StringStream<char>::Last((StringStream<char> *)&ss2.length_);
  QTest::IsNull(test,pcVar4,0x28);
  local_54 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  local_58 = 0x10;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_54,&local_58,0x2a);
  local_5c = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_60 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_5c,&local_60,0x2b);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&str.length_);
  QTest::IsNotNull(test,pcVar4,0x2c);
  StringStream<char>::Reset((StringStream<char> *)&str.length_);
  local_64 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_68 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_64,&local_68,0x2f);
  local_6c = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  local_70 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_6c,&local_70,0x30);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&str.length_);
  QTest::IsNull(test,pcVar4,0x31);
  StringStream<char>::StringStream(&local_80,1);
  StringStream<char>::operator=((StringStream<char> *)&ss2.length_,&local_80);
  StringStream<char>::~StringStream(&local_80);
  StringStream<char>::operator+=((StringStream<char> *)&ss2.length_,'a');
  local_84 = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  local_88 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_84,&local_88,0x35);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&ss2.length_);
  QTest::IsTrue(test,SVar2 != 0,0x36);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&ss2.length_);
  QTest::IsNotNull(test,pcVar4,0x37);
  pcVar4 = StringStream<char>::Last((StringStream<char> *)&ss2.length_);
  QTest::IsNotNull(test,pcVar4,0x38);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&ss2.length_);
  local_89 = 'a';
  QTest::IsEqual<char,char>(test,pcVar4,&local_89,0x39);
  StringStream<char>::GetString(&local_a0);
  QTest::IsEqual<Qentem::String<char>,char[2]>
            (test,(String<char> *)&local_a0,(char (*) [2])0x10a189,0x3a);
  String<char>::~String((String<char> *)&local_a0);
  local_a4 = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  local_a8 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_a4,&local_a8,0x3b);
  local_ac = StringStream<char>::Capacity((StringStream<char> *)&ss2.length_);
  local_b0 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_ac,&local_b0,0x3c);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&ss2.length_);
  QTest::IsNull(test,pcVar4,0x3d);
  String<char>::String(&local_c0,"a");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,&local_c0);
  String<char>::~String(&local_c0);
  local_c4 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_c8 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_c4,&local_c8,0x40);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  QTest::IsTrue(test,SVar2 != 0,0x41);
  StringStream<char>::GetString(&local_d8);
  QTest::IsEqual<Qentem::String<char>,char[2]>
            (test,(String<char> *)&local_d8,(char (*) [2])0x10a189,0x42);
  String<char>::~String((String<char> *)&local_d8);
  StringStream<char>::GetString(&local_e8);
  QTest::IsNotEqual<Qentem::String<char>,char[3]>
            (test,(String<char> *)&local_e8,(char (*) [3])"aa",0x43);
  String<char>::~String((String<char> *)&local_e8);
  String<char>::String(&local_f8,"a");
  String<char>::operator=((String<char> *)local_40,&local_f8);
  String<char>::~String(&local_f8);
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,(String<char> *)local_40);
  local_fc = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_100 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_fc,&local_100,0x47);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  QTest::IsTrue(test,SVar2 != 0,0x48);
  QTest::IsEqual<Qentem::StringStream<char>,char[2]>
            (test,(StringStream<char> *)&str.length_,(char (*) [2])0x10a189,0x49);
  QTest::IsNotEqual<Qentem::StringStream<char>,char[3]>
            (test,(StringStream<char> *)&str.length_,(char (*) [3])"aa",0x4a);
  StringStream<char>::Reset((StringStream<char> *)&str.length_);
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"abc");
  local_104 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_108 = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_104,&local_108,0x4f);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  QTest::IsTrue(test,2 < SVar2,0x50);
  StringStream<char>::GetString((StringStream<char> *)&sss.length_);
  QTest::IsEqual<Qentem::String<char>,char[4]>
            (test,(String<char> *)&sss.length_,(char (*) [4])"abc",0x51);
  String<char>::~String((String<char> *)&sss.length_);
  String<char>::String((String<char> *)local_128);
  String<char>::String(&local_138,"abc");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,&local_138);
  String<char>::~String(&local_138);
  local_13c = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_140 = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_13c,&local_140,0x55);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  QTest::IsTrue(test,2 < SVar2,0x56);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>
            (test,(StringStream<char> *)&str.length_,(char (*) [4])"abc",0x57);
  StringStream<char>::Reset((StringStream<char> *)&str.length_);
  String<char>::String(&local_150,"abc");
  String<char>::operator=((String<char> *)local_40,&local_150);
  String<char>::~String(&local_150);
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,(String<char> *)local_40);
  local_154 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_158 = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_154,&local_158,0x5c);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  QTest::IsTrue(test,2 < SVar2,0x5d);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>
            (test,(StringStream<char> *)&str.length_,(char (*) [4])"abc",0x5e);
  StringStream<char>::Reset((StringStream<char> *)&str.length_);
  String<char>::String(&local_168,"abc");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,&local_168);
  String<char>::~String(&local_168);
  StringStream<char>::operator=
            ((StringStream<char> *)&ss2.length_,(StringStream<char> *)&str.length_);
  lss = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  local_170 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&lss,&local_170,99);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&ss2.length_);
  SVar3 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  QTest::IsTrue(test,SVar3 <= SVar2,100);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>
            (test,(StringStream<char> *)&ss2.length_,(char (*) [4])"abc",0x65);
  StringStream<char>::Reset((StringStream<char> *)&ss2.length_);
  local_174 = StringStream<char>::Capacity((StringStream<char> *)&ss2.length_);
  StringStream<char>::Clear((StringStream<char> *)&ss2.length_);
  local_178 = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  local_17c = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_178,&local_17c,0x6b);
  local_180 = StringStream<char>::Capacity((StringStream<char> *)&ss2.length_);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_180,&local_174,0x6c);
  StringStream<char>::Reset((StringStream<char> *)&ss2.length_);
  pSVar5 = Memory::Move<Qentem::StringStream<char>>((StringStream<char> *)&str.length_);
  StringStream<char>::operator=((StringStream<char> *)&ss2.length_,pSVar5);
  local_184 = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  local_188 = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_184,&local_188,0x70);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&ss2.length_);
  QTest::IsTrue(test,2 < SVar2,0x71);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>
            (test,(StringStream<char> *)&ss2.length_,(char (*) [4])"abc",0x72);
  pcVar4 = StringStream<char>::Storage((StringStream<char> *)&str.length_);
  QTest::IsNull(test,pcVar4,0x73);
  local_18c = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_190 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_18c,&local_190,0x74);
  local_194 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  local_198 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_194,&local_198,0x75);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&str.length_);
  QTest::IsNull(test,pcVar4,0x76);
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,'a');
  StringStream<char>::Reset((StringStream<char> *)&ss2.length_);
  pSVar5 = Memory::Move<Qentem::StringStream<char>>((StringStream<char> *)&str.length_);
  StringStream<char>::operator=((StringStream<char> *)&ss2.length_,pSVar5);
  local_19c = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  local_1a0 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_19c,&local_1a0,0x7b);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&ss2.length_);
  QTest::IsTrue(test,3 < SVar2,0x7c);
  QTest::IsEqual<Qentem::StringStream<char>,char[2]>
            (test,(StringStream<char> *)&ss2.length_,(char (*) [2])0x10a189,0x7d);
  StringStream<char>::Reset((StringStream<char> *)&ss2.length_);
  StringStream<char>::operator+=((StringStream<char> *)&ss2.length_,"abc");
  StringStream<char>::StringStream(&local_1b0,(StringStream<char> *)&ss2.length_);
  StringStream<char>::operator=((StringStream<char> *)&str.length_,&local_1b0);
  StringStream<char>::~StringStream(&local_1b0);
  local_1b4 = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  local_1b8 = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_1b4,&local_1b8,0x82);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&ss2.length_);
  QTest::IsTrue(test,2 < SVar2,0x83);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>
            (test,(StringStream<char> *)&ss2.length_,(char (*) [4])"abc",0x84);
  local_1bc = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_1c0 = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_1bc,&local_1c0,0x85);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  QTest::IsTrue(test,2 < SVar2,0x86);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>
            (test,(StringStream<char> *)&str.length_,(char (*) [4])"abc",0x87);
  StringStream<char>::Reset((StringStream<char> *)&ss2.length_);
  StringStream<char>::Reset((StringStream<char> *)&str.length_);
  StringStream<char>::operator+=((StringStream<char> *)&ss2.length_,"efg");
  pSVar5 = Memory::Move<Qentem::StringStream<char>>((StringStream<char> *)&ss2.length_);
  StringStream<char>::StringStream(&local_1d0,pSVar5);
  StringStream<char>::operator=((StringStream<char> *)&str.length_,&local_1d0);
  StringStream<char>::~StringStream(&local_1d0);
  pcVar4 = StringStream<char>::Storage((StringStream<char> *)&ss2.length_);
  QTest::IsNull(test,pcVar4,0x8d);
  local_1d4 = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  local_1d8 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_1d4,&local_1d8,0x8e);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&ss2.length_);
  QTest::IsTrue(test,SVar2 == 0,0x8f);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&ss2.length_);
  QTest::IsNull(test,pcVar4,0x90);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>
            (test,(StringStream<char> *)&str.length_,(char (*) [4])"efg",0x91);
  local_1dc = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_1e0 = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_1dc,&local_1e0,0x92);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  QTest::IsTrue(test,2 < SVar2,0x93);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&str.length_);
  local_1e1 = 'g';
  QTest::IsEqual<char,char>(test,pcVar4 + 2,&local_1e1,0x94);
  StringStream<char>::Reset((StringStream<char> *)&str.length_);
  StringStream<char>::Write((StringStream<char> *)&str.length_,"a",1);
  local_1e8 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_1ec = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_1e8,&local_1ec,0x98);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  QTest::IsTrue(test,SVar2 != 0,0x99);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  QTest::IsTrue(test,SVar2 != 0,0x9a);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&str.length_);
  QTest::IsNotNull(test,pcVar4,0x9b);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&str.length_);
  local_1ed = 'a';
  QTest::IsEqual<char,char>(test,pcVar4,&local_1ed,0x9c);
  StringStream<char>::Write((StringStream<char> *)&str.length_,"bc",2);
  e_str._4_4_ = StringStream<char>::Length((StringStream<char> *)&str.length_);
  e_str._0_4_ = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)((long)&e_str + 4),(uint *)&e_str,0x9f);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  QTest::IsTrue(test,2 < SVar2,0xa0);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>
            (test,(StringStream<char> *)&str.length_,(char (*) [4])"abc",0xa1);
  StringStream<char>::Reset((StringStream<char> *)&str.length_);
  StringStream<char>::Write((StringStream<char> *)&str.length_,"abcdef",1);
  StringStream<char>::Write((StringStream<char> *)&str.length_,"bcdef",1);
  StringStream<char>::Write((StringStream<char> *)&str.length_,"cdef",1);
  pcStack_200 = StringStream<char>::Detach((StringStream<char> *)&str.length_);
  local_201 = StringUtils::IsEqual<char>(pcStack_200,"abc",3);
  Memory::Deallocate(pcStack_200);
  QTest::IsTrue(test,(bool)(local_201 & 1),0xac);
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"abcdef");
  StringStream<char>::StepBack((StringStream<char> *)&str.length_,10);
  local_208 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_20c = 6;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_208,&local_20c,0xb0);
  StringStream<char>::StepBack((StringStream<char> *)&str.length_,1);
  local_210 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_214 = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_210,&local_214,0xb3);
  StringStream<char>::StepBack((StringStream<char> *)&str.length_,2);
  local_218 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_21c = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_218,&local_21c,0xb6);
  StringStream<char>::StepBack((StringStream<char> *)&str.length_,3);
  local_220 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_224 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_220,&local_224,0xb9);
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"123456789");
  local_228 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  local_22c = 0x75;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_228,&local_22c,0xc9);
  SVar2 = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  QTest::IsTrue(test,0x74 < SVar2,0xca);
  QTest::IsEqual<Qentem::StringStream<char>,char[118]>
            (test,(StringStream<char> *)&str.length_,
             (char (*) [118])
             "123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789"
             ,0xce);
  StringStream<char>::Reset((StringStream<char> *)&ss2.length_);
  StringStream<char>::Reset((StringStream<char> *)&str.length_);
  StringStream<char>::SetLength((StringStream<char> *)&ss2.length_,2);
  local_230 = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  buffer._4_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_230,(uint *)((long)&buffer + 4),0xd4);
  ab = StringStream<char>::Storage((StringStream<char> *)&ss2.length_);
  *ab = 'a';
  ab[1] = 'b';
  local_248 = "ab";
  local_24c = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  local_250 = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_24c,&local_250,0xdc);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&ss2.length_);
  bVar1 = StringUtils::IsEqual<char>(pcVar4,local_248,2);
  QTest::IsTrue(test,bVar1,0xdd);
  ab = StringStream<char>::Buffer((StringStream<char> *)&ss2.length_,1);
  ab2._4_4_ = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  ab2._0_4_ = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)((long)&ab2 + 4),(uint *)&ab2,0xe0);
  *ab = 'c';
  local_260 = "abc";
  local_264 = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  local_268 = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_264,&local_268,0xe4);
  pcVar4 = StringStream<char>::First((StringStream<char> *)&ss2.length_);
  bVar1 = StringUtils::IsEqual<char>(pcVar4,local_260,3);
  QTest::IsTrue(test,bVar1,0xe5);
  StringStream<char>::Clear((StringStream<char> *)&str.length_);
  StringStream<char>::operator+=((StringStream<char> *)&str.length_,"ab");
  local_269 = StringStream<char>::operator==
                        ((StringStream<char> *)&ss2.length_,(StringStream<char> *)&str.length_);
  local_26a = false;
  QTest::IsEqual<bool,bool>(test,&local_269,&local_26a,0xe9);
  StringStream<char>::operator+=((StringStream<char> *)&ss2.length_,"de");
  local_270 = StringStream<char>::Length((StringStream<char> *)&ss2.length_);
  local_274 = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_270,&local_274,0xec);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>
            (test,(StringStream<char> *)&ss2.length_,(char (*) [6])"abcde",0xed);
  StringStream<char>::operator=
            ((StringStream<char> *)&str.length_,(StringStream<char> *)&ss2.length_);
  local_278 = StringStream<char>::Length((StringStream<char> *)&str.length_);
  ss2_p._4_4_ = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_278,(uint *)((long)&ss2_p + 4),0xf0);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>
            (test,(StringStream<char> *)&str.length_,(char (*) [6])"abcde",0xf1);
  StringStream<char>::Reset((StringStream<char> *)&str.length_);
  StringStream<char>::operator+=
            ((StringStream<char> *)&str.length_,"123456789123456789123456789123456789");
  local_288 = StringStream<char>::First((StringStream<char> *)&str.length_);
  StringStream<char>::GetString(&local_298);
  String<char>::operator=((String<char> *)local_40,(String<char> *)&local_298);
  String<char>::~String((String<char> *)&local_298);
  n_str._8_8_ = String<char>::First((String<char> *)local_40);
  QTest::IsEqual<char_const*,char_const*>(test,&local_288,(char **)&n_str.length_,0xf9);
  QTest::IsEqual<Qentem::String<char>,char[37]>
            (test,(String<char> *)local_40,(char (*) [37])0x10a1eb,0xfa);
  StringStream<char>::Reset((StringStream<char> *)&str.length_);
  StringStream<char>::operator=((StringStream<char> *)&ss2.length_,"abcdefgh");
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>
            (test,(StringStream<char> *)&ss2.length_,(char (*) [9])"abcdefgh",0x101);
  operator<<((StringStream<char> *)&str.length_,(StringStream<char> *)&ss2.length_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>
            (test,(StringStream<char> *)&ss2.length_,(char (*) [9])"abcdefgh",0x104);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>
            (test,(StringStream<char> *)&str.length_,(char (*) [9])"abcdefgh",0x105);
  String<char>::String((String<char> *)&sis.max,"12345678");
  StringStream<char>::operator=((StringStream<char> *)&ss2.length_,(String<char> *)&sis.max);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>
            (test,(StringStream<char> *)&ss2.length_,(char (*) [9])0x10a23a,0x109);
  StringStream<char>::Reset((StringStream<char> *)&str.length_);
  operator<<((StringStream<char> *)&str.length_,(String<char> *)&sis.max);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>
            (test,(StringStream<char> *)&str.length_,(char (*) [9])0x10a23a,0x10e);
  TestStringStream1::SimpleStream::SimpleStream((SimpleStream *)local_2d8);
  operator<<((SimpleStream *)local_2d8,(StringStream<char> *)&str.length_);
  bVar1 = StringUtils::IsEqual<char>(local_2d8,"12345678",8);
  QTest::IsTrue(test,bVar1,0x11d);
  operator<<((StringStream<char> *)&str.length_,(String<char> *)&sis.max);
  QTest::IsEqual<Qentem::StringStream<char>,char[17]>
            (test,(StringStream<char> *)&str.length_,(char (*) [17])0x10a232,0x120);
  local_2dc = StringStream<char>::Capacity((StringStream<char> *)&str.length_);
  local_2e0 = 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_2dc,&local_2e0,0x121);
  operator<<((StringStream<char> *)&str.length_,"1234567812345678");
  sis.str[0x1c] = '\0';
  sis.str[0x1d] = '\0';
  sis.str[0x1e] = '\0';
  sis.str[0x1f] = '\0';
  operator<<((SimpleStream *)local_2d8,(StringStream<char> *)&str.length_);
  bVar1 = StringUtils::IsEqual<char>(local_2d8,"12345678123456781234567812345678",0x20);
  QTest::IsTrue(test,bVar1,0x127);
  StringStream<char>::StepBack((StringStream<char> *)&str.length_,1);
  sis.str[0x1c] = '\0';
  sis.str[0x1d] = '\0';
  sis.str[0x1e] = '\0';
  sis.str[0x1f] = '\0';
  operator<<((SimpleStream *)local_2d8,(StringStream<char> *)&str.length_);
  bVar1 = StringUtils::IsEqual<char>(local_2d8,"1234567",7);
  QTest::IsTrue(test,bVar1,300);
  String<char>::~String((String<char> *)&sis.max);
  String<char>::~String((String<char> *)local_128);
  String<char>::~String((String<char> *)local_40);
  StringStream<char>::~StringStream((StringStream<char> *)&str.length_);
  StringStream<char>::~StringStream((StringStream<char> *)&ss2.length_);
  return;
}

Assistant:

static void TestStringStream1(QTest &test) {
    StringStream<char> ss1;
    StringStream<char> ss2{10}; // Preset size
    String<char>       str;

    test.IsEqual(ss1.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss1.Capacity(), SizeT{0}, __LINE__);
    test.IsNull(ss1.First(), __LINE__);
    test.IsNull(ss1.Last(), __LINE__);

    test.IsEqual(ss2.Capacity(), SizeT{16}, __LINE__);
    test.IsEqual(ss2.Length(), SizeT{0}, __LINE__);
    test.IsNotNull(ss2.First(), __LINE__);

    ss2.Reset();
    test.IsEqual(ss2.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss2.Capacity(), SizeT{0}, __LINE__);
    test.IsNull(ss2.First(), __LINE__);

    ss1 = StringStream<char>(1);
    ss1 += 'a';
    test.IsEqual(ss1.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss1.Capacity() >= SizeT{1}), __LINE__);
    test.IsNotNull(ss1.First(), __LINE__);
    test.IsNotNull(ss1.Last(), __LINE__);
    test.IsEqual(ss1.First()[0], 'a', __LINE__);
    test.IsEqual(ss1.GetString(), "a", __LINE__);
    test.IsEqual(ss1.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss1.Capacity(), SizeT{0}, __LINE__);
    test.IsNull(ss1.First(), __LINE__);

    ss2 += String<char>("a");
    test.IsEqual(ss2.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{1}), __LINE__);
    test.IsEqual(ss2.GetString(), "a", __LINE__);
    test.IsNotEqual(ss2.GetString(), "aa", __LINE__);

    str = String<char>("a");
    ss2 += str;
    test.IsEqual(ss2.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{1}), __LINE__);
    test.IsEqual(ss2, "a", __LINE__);
    test.IsNotEqual(ss2, "aa", __LINE__);

    ss2.Reset();

    ss2 += "abc";
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2.GetString(), "abc", __LINE__);
    const String<char> sss;

    ss2 += String<char>("abc");
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2, "abc", __LINE__);
    ss2.Reset();

    str = String<char>("abc");
    ss2 += str;
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2, "abc", __LINE__);
    ss2.Reset();

    ss2 += String<char>("abc");
    ss1 = ss2; // Copy
    test.IsEqual(ss1.Length(), ss2.Length(), __LINE__);
    test.IsTrue((ss1.Capacity() >= ss2.Length()), __LINE__);
    test.IsEqual(ss1, "abc", __LINE__);
    ss1.Reset();

    const SizeT lss = ss1.Capacity();

    ss1.Clear();
    test.IsEqual(ss1.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss1.Capacity(), lss, __LINE__);

    ss1.Reset();
    ss1 = Memory::Move(ss2); // Move
    test.IsEqual(ss1.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss1.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss1, "abc", __LINE__);
    test.IsNull(ss2.Storage(), __LINE__);
    test.IsEqual(ss2.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss2.Capacity(), SizeT{0}, __LINE__);
    test.IsNull(ss2.First(), __LINE__);

    ss2 += 'a';
    ss1.Reset();
    ss1 = Memory::Move(ss2); // Move
    test.IsEqual(ss1.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss1.Capacity() >= SizeT{4}), __LINE__);
    test.IsEqual(ss1, "a", __LINE__);
    ss1.Reset();

    ss1 += "abc";
    ss2 = StringStream<char>(ss1); // Copy
    test.IsEqual(ss1.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss1.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss1, "abc", __LINE__);
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2, "abc", __LINE__);
    ss1.Reset();
    ss2.Reset();

    ss1 += "efg";
    ss2 = StringStream<char>(Memory::Move(ss1)); // Move
    test.IsNull(ss1.Storage(), __LINE__);
    test.IsEqual(ss1.Length(), SizeT{0}, __LINE__);
    test.IsTrue((ss1.Capacity() == SizeT{0}), __LINE__);
    test.IsNull(ss1.First(), __LINE__);
    test.IsEqual(ss2, "efg", __LINE__);
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2.First()[2], 'g', __LINE__);

    ss2.Reset();
    ss2.Write("a", SizeT{1});
    test.IsEqual(ss2.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{1}), __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{1}), __LINE__);
    test.IsNotNull(ss2.First(), __LINE__);
    test.IsEqual(ss2.First()[0], 'a', __LINE__);

    ss2.Write("bc", SizeT{2});
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2, "abc", __LINE__);
    ss2.Reset();

    ss2.Write("abcdef", SizeT{1});
    ss2.Write("bcdef", SizeT{1});
    ss2.Write("cdef", SizeT{1});

    char      *e_str    = ss2.Detach();
    const bool is_equal = StringUtils::IsEqual(e_str, "abc", SizeT{3});
    Memory::Deallocate(e_str);

    test.IsTrue(is_equal, __LINE__);

    ss2 += "abcdef";
    ss2.StepBack(10);
    test.IsEqual(ss2.Length(), SizeT{6}, __LINE__);

    ss2.StepBack(1);
    test.IsEqual(ss2.Length(), SizeT{5}, __LINE__);

    ss2.StepBack(2);
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);

    ss2.StepBack(3);
    test.IsEqual(ss2.Length(), SizeT{0}, __LINE__);

    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";

    test.IsEqual(ss2.Length(), SizeT{117}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{117}), __LINE__);
    test.IsEqual(
        ss2,
        "123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789",
        __LINE__);

    ss1.Reset();
    ss2.Reset();

    ss1.SetLength(2);
    test.IsEqual(ss1.Length(), SizeT{2}, __LINE__);

    char *buffer = ss1.Storage();
    buffer[0]    = 'a';
    buffer[1]    = 'b';

    const char *ab = "ab";

    test.IsEqual(ss1.Length(), SizeT{2}, __LINE__);
    test.IsTrue(StringUtils::IsEqual(ss1.First(), ab, SizeT{2}), __LINE__);

    buffer = ss1.Buffer(1);
    test.IsEqual(ss1.Length(), SizeT{3}, __LINE__);

    buffer[0]       = 'c';
    const char *ab2 = "abc";
    test.IsEqual(ss1.Length(), SizeT{3}, __LINE__);
    test.IsTrue(StringUtils::IsEqual(ss1.First(), ab2, SizeT{3}), __LINE__);

    ss2.Clear();
    ss2 += "ab";
    test.IsEqual((ss1 == ss2), false, __LINE__);

    ss1 += "de";
    test.IsEqual(ss1.Length(), SizeT{5}, __LINE__);
    test.IsEqual(ss1, "abcde", __LINE__);

    ss2 = ss1;
    test.IsEqual(ss2.Length(), SizeT{5}, __LINE__);
    test.IsEqual(ss2, "abcde", __LINE__);

    ss2.Reset();

    /////////
    ss2 += "123456789123456789123456789123456789";
    const char *ss2_p = ss2.First();
    str               = ss2.GetString();
    test.IsEqual(ss2_p, str.First(), __LINE__);
    test.IsEqual(str, "123456789123456789123456789123456789", __LINE__);

    /////////

    ss2.Reset();

    ss1 = "abcdefgh";
    test.IsEqual(ss1, "abcdefgh", __LINE__);

    ss2 << ss1;
    test.IsEqual(ss1, "abcdefgh", __LINE__);
    test.IsEqual(ss2, "abcdefgh", __LINE__);

    const String<char> n_str = String<char>("12345678");
    ss1                      = n_str;
    test.IsEqual(ss1, "12345678", __LINE__);

    ss2.Reset();

    ss2 << n_str;
    test.IsEqual(ss2, "12345678", __LINE__);

    struct SimpleStream {
        char          str[32]{0};
        const SizeT32 max = 32U;
        SizeT32       index{0};

        void operator<<(const char ch) noexcept {
            str[index] = ch;
            ++index;
        }
    };

    SimpleStream sis;
    sis << ss2;
    test.IsTrue(StringUtils::IsEqual(&(sis.str[0]), "12345678", SizeT{8}), __LINE__);

    ss2 << n_str;
    test.IsEqual(ss2, "1234567812345678", __LINE__);
    test.IsEqual(ss2.Capacity(), SizeT{32}, __LINE__);

    ss2 << "1234567812345678";
    sis.index = SizeT{0};
    sis << ss2;

    test.IsTrue(StringUtils::IsEqual(&(sis.str[0]), "12345678123456781234567812345678", SizeT{32}), __LINE__);

    ss2.StepBack(1);
    sis.index = SizeT{0};
    sis << ss2;
    test.IsTrue(StringUtils::IsEqual(&(sis.str[0]), "1234567", SizeT{7}), __LINE__);
}